

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

bool __thiscall cornerstone::raft_server::is_leader(raft_server *this)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  undefined1 auVar3 [16];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptVar4;
  iterator __position;
  ulong uVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  vector<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  peer_resp_times;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *ptStack_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_38;
  
  std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
  if (((this->role_ == leader) && ((this->peers_)._M_h._M_element_count != 0)) &&
     (*(int *)(((this->ctx_)._M_t.
                super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                ._M_t.
                super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_)._M_t.
              super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
      * 2 < is_leader::time_elasped_since_quorum_resp)) {
    local_48 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)0x0;
    ptStack_40 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)0x0;
    local_38 = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)0x0;
    ptVar4 = local_48;
    __position._M_current = ptStack_40;
    for (p_Var2 = (this->peers_)._M_h._M_before_begin._M_nxt; local_48 = ptVar4,
        ptStack_40 = __position._M_current, p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      if (__position._M_current == local_38) {
        std::
        vector<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
        ::
        _M_realloc_insert<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const&>
                  ((vector<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>
                    *)&local_48,__position,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)(p_Var2[2]._M_nxt + 10));
      }
      else {
        ((__position._M_current)->__d).__r = ((duration *)&p_Var2[2]._M_nxt[10]._M_nxt)->__r;
        ptStack_40 = __position._M_current + 1;
      }
      ptVar4 = local_48;
      __position._M_current = ptStack_40;
    }
    if (ptVar4 != __position._M_current) {
      uVar5 = (long)__position._M_current - (long)ptVar4 >> 3;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>*,std::vector<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ptVar4,__position._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>*,std::vector<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ptVar4,__position._M_current);
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar6 - *(long *)((long)&(local_48->__d).__r +
                                      ((this->peers_)._M_h._M_element_count & 0xfffffffffffffffe) *
                                      4)) * SEXT816(0x431bde82d7b634db);
    iVar7 = (int)(auVar3._8_8_ >> 0x12) - (auVar3._12_4_ >> 0x1f);
    iVar1 = *(int *)(((this->ctx_)._M_t.
                      super___uniq_ptr_impl<cornerstone::context,_std::default_delete<cornerstone::context>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cornerstone::context_*,_std::default_delete<cornerstone::context>_>
                      .super__Head_base<0UL,_cornerstone::context_*,_false>._M_head_impl)->params_).
                    _M_t.
                    super___uniq_ptr_impl<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
    ;
    is_leader::time_elasped_since_quorum_resp = iVar7;
    if (local_48 !=
        (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    if (iVar1 * 2 < iVar7) {
      bVar8 = false;
      goto LAB_0014ae24;
    }
  }
  bVar8 = this->role_ == leader;
LAB_0014ae24:
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  return bVar8;
}

Assistant:

bool raft_server::is_leader() const
{
    static volatile int32 time_elasped_since_quorum_resp(std::numeric_limits<int32>::max());
    read_lock(peers_lock_);
    if (role_ == srv_role::leader && peers_.size() > 0 &&
        time_elasped_since_quorum_resp > ctx_->params_->election_timeout_upper_bound_ * 2)
    {
        std::vector<time_point> peer_resp_times;
        for (auto& peer : peers_)
        {
            peer_resp_times.push_back(peer.second->get_last_resp());
        }

        std::sort(peer_resp_times.begin(), peer_resp_times.end());
        time_elasped_since_quorum_resp =
            static_cast<int32>(std::chrono::duration_cast<std::chrono::milliseconds>(
                                   system_clock::now() - peer_resp_times[peers_.size() / 2])
                                   .count());
        if (time_elasped_since_quorum_resp > ctx_->params_->election_timeout_upper_bound_ * 2)
        {
            return false;
        }
    }

    return role_ == srv_role::leader;
}